

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuickprof.cpp
# Opt level: O1

void __thiscall CProfileNode::CProfileNode(CProfileNode *this,char *name,CProfileNode *parent)

{
  this->Name = name;
  this->TotalCalls = 0;
  this->TotalTime = 0.0;
  this->StartTime = 0;
  this->RecursionCounter = 0;
  this->Parent = parent;
  this->Child = (CProfileNode *)0x0;
  this->Sibling = (CProfileNode *)0x0;
  this->m_userPtr = (void *)0x0;
  Reset(this);
  return;
}

Assistant:

CProfileNode::CProfileNode( const char * name, CProfileNode * parent ) :
	Name( name ),
	TotalCalls( 0 ),
	TotalTime( 0 ),
	StartTime( 0 ),
	RecursionCounter( 0 ),
	Parent( parent ),
	Child( NULL ),
	Sibling( NULL ),
	m_userPtr(0)
{
	Reset();
}